

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
::internal_clear(btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                 *this,node_type *node)

{
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *node_00;
  ulong i;
  
  if (((ulong)node & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (node[0xb] != (node_type)0x0) {
    delete_leaf_node(this,node);
    return;
  }
  i = 0xffffffffffffffff;
  do {
    i = i + 1;
    node_00 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
              ::child(node,i);
    internal_clear(this,node_00);
  } while (i < (byte)node[10]);
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  ::destroy(node,(allocator_type *)node_00);
  deallocate((btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
              *)(this->root_).
                super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
                .
                super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>_*>
                .
                super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<phmap::test_internal::MovableOnlyInstance>,_false>
                ._M_head_impl.super_CountingAllocator<phmap::test_internal::MovableOnlyInstance>.
                bytes_used_,0x180,node);
  return;
}

Assistant:

void btree<P>::internal_clear(node_type *node) {
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                internal_clear(node->child(i));
            }
            delete_internal_node(node);
        } else {
            delete_leaf_node(node);
        }
    }